

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         write_significand<fmt::v8::appender,char,unsigned_long,fmt::v8::detail::digit_grouping<char>>
                   (appender out,unsigned_long significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  char *pcVar1;
  type tVar2;
  appender aVar3;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  
  if ((grouping->sep_).thousands_sep != '\0') {
    local_238.super_buffer<char>.ptr_ = local_238.store_;
    local_238.super_buffer<char>.size_ = 0;
    local_238.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0012ebe8;
    local_238.super_buffer<char>.capacity_ = 500;
    write_significand<fmt::v8::appender,_unsigned_long,_char,_0>
              ((appender)&local_238,significand,significand_size,integral_size,decimal_point);
    pcVar1 = local_238.super_buffer<char>.ptr_;
    tVar2 = to_unsigned<int>(integral_size);
    digits.size_._0_4_ = tVar2;
    digits.data_ = pcVar1;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    aVar3 = copy_str_noinline<char,char*,fmt::v8::appender>
                      (local_238.super_buffer<char>.ptr_ + integral_size,
                       local_238.super_buffer<char>.ptr_ + local_238.super_buffer<char>.size_,out);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_238);
    return (appender)
           aVar3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  aVar3 = write_significand<fmt::v8::appender,_unsigned_long,_char,_0>
                    (out,significand,significand_size,integral_size,decimal_point);
  return (appender)aVar3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}